

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iinq.c
# Opt level: O1

ion_err_t iinq_drop(char *schema_file_name)

{
  ion_err_t iVar1;
  ion_dictionary_t dictionary;
  ion_dictionary_handler_t handler;
  ion_dictionary_t iStack_78;
  ion_dictionary_handler_t local_60;
  
  iStack_78.handler = &local_60;
  iVar1 = iinq_open_source(schema_file_name,&iStack_78,iStack_78.handler);
  if (iVar1 == '\0') {
    iVar1 = dictionary_delete_dictionary(&iStack_78);
    remove(schema_file_name);
  }
  return iVar1;
}

Assistant:

ion_err_t
iinq_drop(
	char *schema_file_name
) {
	ion_err_t					error;
	ion_dictionary_t			dictionary;
	ion_dictionary_handler_t	handler;

	dictionary.handler	= &handler;

	error				= iinq_open_source(schema_file_name, &dictionary, &handler);

	if (err_ok != error) {
		return error;
	}

	error = dictionary_delete_dictionary(&dictionary);

	fremove(schema_file_name);

	return error;
}